

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

bool __thiscall
miniros::PollSet::addSocket
          (PollSet *this,int fd,SocketUpdateFunc *update_func,TransportPtr *transport)

{
  __sighandler_t __handler;
  int iVar1;
  void *pvVar3;
  ulong uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_bool> pVar5;
  allocator<char> local_a9;
  pair<int,_miniros::PollSet::SocketInfo> local_a8;
  SocketInfo info;
  pair<int,_miniros::PollSet::SocketInfo> *ppVar2;
  
  uVar4 = (ulong)(uint)fd;
  info.func_.super__Function_base._M_manager = (_Manager_type)0x0;
  info.func_._M_invoker = (_Invoker_type)0x0;
  info.func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  info.func_.super__Function_base._M_functor._8_8_ = 0;
  info.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  info.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  info.events_ = 0;
  info.fd_ = fd;
  std::__shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)&info,
             &transport->super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(int)>::operator=(&info.func_,update_func);
  std::mutex::lock(&this->socket_info_mutex_);
  local_a8.first = fd;
  SocketInfo::SocketInfo(&local_a8.second,&info);
  ppVar2 = &local_a8;
  pVar5 = std::
          _Rb_tree<int,std::pair<int_const,miniros::PollSet::SocketInfo>,std::_Select1st<std::pair<int_const,miniros::PollSet::SocketInfo>>,std::less<int>,std::allocator<std::pair<int_const,miniros::PollSet::SocketInfo>>>
          ::_M_emplace_unique<std::pair<int,miniros::PollSet::SocketInfo>>
                    ((_Rb_tree<int,std::pair<int_const,miniros::PollSet::SocketInfo>,std::_Select1st<std::pair<int_const,miniros::PollSet::SocketInfo>>,std::less<int>,std::allocator<std::pair<int_const,miniros::PollSet::SocketInfo>>>
                      *)this,ppVar2);
  iVar1 = (int)ppVar2;
  SocketInfo::~SocketInfo(&local_a8.second);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    fd = iVar1;
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (addSocket::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"miniros.poll_set",&local_a9);
      ppVar2 = &local_a8;
      console::initializeLogLocation(&addSocket::loc,(string *)ppVar2,Debug);
      fd = (int)ppVar2;
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if (addSocket::loc.level_ != Debug) {
      fd = 0;
      console::setLogLocationLevel(&addSocket::loc,Debug);
      console::checkLogLocationEnabled(&addSocket::loc);
    }
    if (addSocket::loc.logger_enabled_ == true) {
      pvVar3 = addSocket::loc.logger_;
      console::print((FilterBase *)0x0,addSocket::loc.logger_,addSocket::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x52,
                     "bool miniros::PollSet::addSocket(int, const SocketUpdateFunc &, const TransportPtr &)"
                     ,"PollSet: Tried to add duplicate fd [%d]",uVar4);
      fd = (int)pvVar3;
    }
  }
  else {
    add_socket_to_watcher(this->epfd_,fd);
    this->sockets_changed_ = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    signal(this,fd,__handler);
  }
  SocketInfo::~SocketInfo(&info);
  return (bool)(pVar5.second & 1);
}

Assistant:

bool PollSet::addSocket(int fd, const SocketUpdateFunc& update_func, const TransportPtr& transport)
{
  SocketInfo info;
  info.fd_ = fd;
  info.events_ = 0;
  info.transport_ = transport;
  info.func_ = update_func;

  {
    std::scoped_lock<std::mutex> lock(socket_info_mutex_);

    bool b = socket_info_.insert(std::make_pair(fd, info)).second;
    if (!b)
    {
      MINIROS_DEBUG("PollSet: Tried to add duplicate fd [%d]", fd);
      return false;
    }

    add_socket_to_watcher(epfd_, fd);

    sockets_changed_ = true;
  }

  signal();

  return true;
}